

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

int google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  bool bVar1;
  int iVar2;
  Descriptor *this;
  undefined4 extraout_var;
  size_type sVar4;
  reference ppFVar5;
  MessageOptions *this_00;
  UnknownFieldSet *pUVar6;
  int local_50;
  int i;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int our_size;
  Reflection *message_reflection;
  Descriptor *descriptor;
  Message *message_local;
  long *plVar3;
  
  this = Message::GetDescriptor(message);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_40);
  (**(code **)(*plVar3 + 0x60))
            (plVar3,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_40);
  local_50 = 0;
  while( true ) {
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_40);
    if (sVar4 <= (ulong)(long)local_50) break;
    ppFVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)local_40,(long)local_50);
    iVar2 = FieldByteSize(*ppFVar5,message);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         iVar2 + fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_50 = local_50 + 1;
  }
  this_00 = Descriptor::options(this);
  bVar1 = MessageOptions::message_set_wire_format(this_00);
  if (bVar1) {
    pUVar6 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
    iVar2 = ComputeUnknownMessageSetItemsSize(pUVar6);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         iVar2 + fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  else {
    pUVar6 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
    iVar2 = ComputeUnknownFieldsSize(pUVar6);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         iVar2 + fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  iVar2 = fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_40);
  return iVar2;
}

Assistant:

int WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  int our_size = 0;

  vector<const FieldDescriptor*> fields;
  message_reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
      message_reflection->GetUnknownFields(message));
  } else {
    our_size += ComputeUnknownFieldsSize(
      message_reflection->GetUnknownFields(message));
  }

  return our_size;
}